

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.hpp
# Opt level: O0

void __thiscall helics::InterfaceInfo::~InterfaceInfo(InterfaceInfo *this)

{
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_guarded((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)0x58e1ff);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_guarded((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)0x58e210);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_guarded((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)0x58e21e);
  return;
}

Assistant:

InterfaceInfo() = default;